

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O1

bool bssl::dtls1_add_change_cipher_spec(SSL *ssl)

{
  bool bVar1;
  uint16_t uVar2;
  Array<unsigned_char> local_28;
  
  uVar2 = ssl_protocol_version(ssl);
  bVar1 = true;
  if (uVar2 < 0x304) {
    local_28.data_ = (uchar *)0x0;
    local_28.size_ = 0;
    bVar1 = add_outgoing(ssl,true,&local_28);
    OPENSSL_free(local_28.data_);
  }
  return bVar1;
}

Assistant:

bool dtls1_add_change_cipher_spec(SSL *ssl) {
  // DTLS 1.3 disables compatibility mode, which means that DTLS 1.3 never sends
  // a ChangeCipherSpec message.
  if (ssl_protocol_version(ssl) > TLS1_2_VERSION) {
    return true;
  }
  return add_outgoing(ssl, true /* ChangeCipherSpec */, Array<uint8_t>());
}